

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CS248::DynamicScene::Scene::selectHalfedge(Scene *this)

{
  HalfedgeElement *this_00;
  Face *pFVar1;
  Edge *pEVar2;
  Vertex *pVVar3;
  HalfedgeIter *pHVar4;
  
  this_00 = (this->selected).element;
  if (this_00 != (HalfedgeElement *)0x0) {
    pFVar1 = HalfedgeElement::getFace(this_00);
    pEVar2 = HalfedgeElement::getEdge((this->selected).element);
    pVVar3 = HalfedgeElement::getVertex((this->selected).element);
    if (pFVar1 == (Face *)0x0) {
      if (pEVar2 == (Edge *)0x0) {
        if (pVVar3 == (Vertex *)0x0) {
          return;
        }
        pHVar4 = &pVVar3->_halfedge;
      }
      else {
        pHVar4 = &pEVar2->_halfedge;
      }
    }
    else {
      pHVar4 = &pFVar1->_halfedge;
    }
    (this->selected).element = (HalfedgeElement *)(pHVar4->_M_node + 1);
  }
  return;
}

Assistant:

void Scene::selectHalfedge() {
  if (selected.element) {
    Face *f = selected.element->getFace();
    Edge *e = selected.element->getEdge();
    Vertex *v = selected.element->getVertex();
    HalfedgeIter h;
    if (f != nullptr) {
      h = f->halfedge();
    } else if (e != nullptr) {
      h = e->halfedge();
    } else if (v != nullptr) {
      h = v->halfedge();
    } else {
      return;
    }
    selected.element = elementAddress(h);
  }
}